

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_CreateSession
               (UA_Server *server,UA_SecureChannel *channel,UA_CreateSessionRequest *request,
               UA_CreateSessionResponse *response)

{
  size_t sVar1;
  undefined2 uVar2;
  UA_NodeIdType UVar3;
  UA_Session *pUVar4;
  UA_StatusCode UVar5;
  ulong uVar6;
  UA_SecureChannel *channel_00;
  size_t i;
  ulong uVar7;
  long lVar8;
  UA_Session *local_48;
  UA_Session *newSession;
  UA_SecureChannel *local_38;
  
  if ((channel->securityToken).channelId == 0) {
    (response->responseHeader).serviceResult = 0x80220000;
  }
  else {
    channel_00 = (UA_SecureChannel *)server->endpointDescriptionsSize;
    UVar5 = UA_Array_copy(server->endpointDescriptions,(size_t)channel_00,&response->serverEndpoints
                          ,UA_TYPES + 0x9b);
    (response->responseHeader).serviceResult = UVar5;
    if (UVar5 == 0) {
      uVar6 = server->endpointDescriptionsSize;
      response->serverEndpointsSize = uVar6;
      lVar8 = 0;
      newSession = (UA_Session *)request;
      local_38 = channel;
      for (uVar7 = 0; pUVar4 = newSession, uVar7 < uVar6; uVar7 = uVar7 + 1) {
        channel_00 = (UA_SecureChannel *)
                     ((long)&(response->serverEndpoints->endpointUrl).length + lVar8);
        UA_String_copy(&request->endpointUrl,(UA_String *)channel_00);
        uVar6 = response->serverEndpointsSize;
        lVar8 = lVar8 + 0xd8;
      }
      UVar5 = UA_SessionManager_createSession
                        (&server->sessionManager,channel_00,(UA_CreateSessionRequest *)newSession,
                         &local_48);
      (response->responseHeader).serviceResult = UVar5;
      if (UVar5 == 0) {
        local_48->maxResponseMessageSize =
             (UA_UInt32)pUVar4[1].clientDescription.applicationName.text.length;
        local_48->maxRequestMessageSize = (local_38->connection->localConf).maxMessageSize;
        (response->sessionId).identifier.string.data = (local_48->sessionId).identifier.string.data;
        uVar2 = *(undefined2 *)&(local_48->sessionId).field_0x2;
        UVar3 = (local_48->sessionId).identifierType;
        sVar1 = (local_48->sessionId).identifier.string.length;
        (response->sessionId).namespaceIndex = (local_48->sessionId).namespaceIndex;
        *(undefined2 *)&(response->sessionId).field_0x2 = uVar2;
        (response->sessionId).identifierType = UVar3;
        (response->sessionId).identifier.string.length = sVar1;
        response->revisedSessionTimeout = local_48->timeout;
        uVar2 = *(undefined2 *)&(local_48->authenticationToken).field_0x2;
        UVar3 = (local_48->authenticationToken).identifierType;
        sVar1 = (local_48->authenticationToken).identifier.string.length;
        (response->authenticationToken).namespaceIndex =
             (local_48->authenticationToken).namespaceIndex;
        *(undefined2 *)&(response->authenticationToken).field_0x2 = uVar2;
        (response->authenticationToken).identifierType = UVar3;
        (response->authenticationToken).identifier.string.length = sVar1;
        (response->authenticationToken).identifier.string.data =
             (local_48->authenticationToken).identifier.string.data;
        UVar5 = UA_String_copy((UA_String *)&(pUVar4->responseQueue).sqh_last,&local_48->sessionName
                              );
        (response->responseHeader).serviceResult = UVar5;
        if (server->endpointDescriptionsSize != 0) {
          UVar5 = UA_ByteString_copy(&server->endpointDescriptions->serverCertificate,
                                     &response->serverCertificate);
          UVar5 = UVar5 | (response->responseHeader).serviceResult;
          (response->responseHeader).serviceResult = UVar5;
        }
        if (UVar5 != 0) {
          UA_SessionManager_removeSession(&server->sessionManager,&local_48->authenticationToken);
        }
      }
    }
  }
  return;
}

Assistant:

void Service_CreateSession(UA_Server *server, UA_SecureChannel *channel,
                           const UA_CreateSessionRequest *request,
                           UA_CreateSessionResponse *response) {
    if(channel->securityToken.channelId == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSECURECHANNELIDINVALID;
        return;
    }

    /* Copy the server's endpoint into the response */
    response->responseHeader.serviceResult =
        UA_Array_copy(server->endpointDescriptions, server->endpointDescriptionsSize,
                      (void**)&response->serverEndpoints, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD)
        return;
    response->serverEndpointsSize = server->endpointDescriptionsSize;

    /* Mirror back the endpointUrl */
    for(size_t i = 0; i < response->serverEndpointsSize; ++i)
        UA_String_copy(&request->endpointUrl, &response->serverEndpoints[i].endpointUrl);

    UA_Session *newSession;
    response->responseHeader.serviceResult =
        UA_SessionManager_createSession(&server->sessionManager, channel, request, &newSession);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel, "Processing CreateSessionRequest failed");
        return;
    }

    newSession->maxResponseMessageSize = request->maxResponseMessageSize;
    newSession->maxRequestMessageSize = channel->connection->localConf.maxMessageSize;
    response->sessionId = newSession->sessionId;
    response->revisedSessionTimeout = (UA_Double)newSession->timeout;
    response->authenticationToken = newSession->authenticationToken;
    response->responseHeader.serviceResult = UA_String_copy(&request->sessionName, &newSession->sessionName);
    if(server->endpointDescriptionsSize > 0)
        response->responseHeader.serviceResult |=
            UA_ByteString_copy(&server->endpointDescriptions->serverCertificate,
                               &response->serverCertificate);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_SessionManager_removeSession(&server->sessionManager, &newSession->authenticationToken);
         return;
    }
    UA_LOG_DEBUG_CHANNEL(server->config.logger, channel, "Session " UA_PRINTF_GUID_FORMAT " created",
                         UA_PRINTF_GUID_DATA(newSession->sessionId.identifier.guid));
}